

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclDumpGenlib(char *pFileName,SC_Lib *p,float SlewInit,float Gain,int nGatesMin)

{
  FILE *__stream;
  Vec_Str_t *p_00;
  char *pcVar1;
  float local_434;
  FILE *pFile;
  Vec_Str_t *vStr;
  char local_418 [4];
  float Slew;
  char FileName [1000];
  uint local_28;
  uint local_24;
  int nCellCount;
  int nGatesMin_local;
  float Gain_local;
  float SlewInit_local;
  SC_Lib *p_local;
  char *pFileName_local;
  
  local_28 = 0;
  local_434 = SlewInit;
  local_24 = nGatesMin;
  nCellCount = (int)Gain;
  nGatesMin_local = (int)SlewInit;
  _Gain_local = p;
  p_local = (SC_Lib *)pFileName;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_434 = Abc_SclComputeAverageSlew(p);
  }
  if (p_local == (SC_Lib *)0x0) {
    sprintf(local_418,"%s_s%03d_g%03d_m%d.genlib",_Gain_local->pName,(ulong)(uint)(int)local_434,
            (ulong)(uint)(int)(float)nCellCount,(ulong)local_24);
  }
  else {
    sprintf(local_418,"%s",p_local);
  }
  __stream = fopen(local_418,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",local_418);
  }
  else {
    p_00 = Abc_SclProduceGenlibStr
                     (_Gain_local,local_434,(float)nCellCount,local_24,(int *)&local_28);
    pcVar1 = Vec_StrArray(p_00);
    fprintf(__stream,"%s",pcVar1);
    Vec_StrFree(p_00);
    fclose(__stream);
    printf("Written GENLIB library with %d gates into file \"%s\".\n",(ulong)local_28,local_418);
  }
  return;
}

Assistant:

void Abc_SclDumpGenlib( char * pFileName, SC_Lib * p, float SlewInit, float Gain, int nGatesMin )
{
    int nCellCount = 0;
    char FileName[1000];
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    Vec_Str_t * vStr;
    FILE * pFile;
    if ( pFileName == NULL )
        sprintf( FileName, "%s_s%03d_g%03d_m%d.genlib", p->pName, (int)Slew, (int)Gain, nGatesMin );
    else
        sprintf( FileName, "%s", pFileName );
    pFile = fopen( FileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", FileName );
        return;
    }
    vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nCellCount );
    fprintf( pFile, "%s", Vec_StrArray(vStr) );
    Vec_StrFree( vStr );
    fclose( pFile );
    printf( "Written GENLIB library with %d gates into file \"%s\".\n", nCellCount, FileName );
}